

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::save(Dictionary *this,ostream *out)

{
  char *pcVar1;
  long lVar2;
  char *in_RSI;
  long in_RDI;
  entry e;
  int32_t i;
  entry *this_00;
  entry *in_stack_ffffffffffffff18;
  entry *in_stack_ffffffffffffff20;
  undefined1 local_d0 [8];
  undefined1 local_c8 [180];
  int local_14;
  char *local_10;
  
  local_10 = in_RSI;
  std::ostream::write(in_RSI,in_RDI + 0x88);
  std::ostream::write(local_10,in_RDI + 0x94);
  std::ostream::write(local_10,in_RDI + 0x98);
  std::ostream::write(local_10,in_RDI + 0xa0);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x88); local_14 = local_14 + 1) {
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x58),
               (long)local_14);
    this_00 = (entry *)&stack0xffffffffffffff10;
    entry::entry(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pcVar1 = local_10;
    lVar2 = std::__cxx11::string::data();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar2);
    std::ostream::put((char)local_10);
    std::ostream::write(local_10,(long)local_d0);
    std::ostream::write(local_10,(long)local_c8);
    entry::~entry(this_00);
  }
  return;
}

Assistant:

void Dictionary::save(std::ostream& out) const {
  out.write((char*) &size_, sizeof(int32_t));
  out.write((char*) &nwords_, sizeof(int32_t));
  out.write((char*) &nlabels_, sizeof(int32_t));
  out.write((char*) &ntokens_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    entry e = words_[i];
    out.write(e.word.data(), e.word.size() * sizeof(char));
    out.put(0);
    out.write((char*) &(e.count), sizeof(int64_t));
    out.write((char*) &(e.type), sizeof(entry_type));
  }
}